

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O0

void __thiscall Paragraph::~Paragraph(Paragraph *this)

{
  Paragraph *this_local;
  
  ~Paragraph(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Paragraph(std::string text)
		:	TextElement{std::move(text)}
	{}